

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VehicleState.cpp
# Opt level: O3

int __thiscall
VehicleState::clone(VehicleState *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  
  puVar2 = (undefined8 *)operator_new(0x30);
  puVar2[1] = 0x100000001;
  *puVar2 = &PTR___Sp_counted_ptr_inplace_00120d30;
  *(undefined8 **)&this->current_cargo = puVar2;
  this->p = (Point *)(puVar2 + 2);
  puVar2[2] = *(undefined8 *)__fn;
  *(undefined4 *)(puVar2 + 3) = *(undefined4 *)(__fn + 8);
  uVar1 = *(undefined8 *)(__fn + 0x18);
  puVar2[4] = *(undefined8 *)(__fn + 0x10);
  puVar2[5] = uVar1;
  return (int)this;
}

Assistant:

std::shared_ptr<VehicleState> VehicleState::clone()
const {
	auto vs = std::make_shared<VehicleState>();
	vs->p = this->p;
	
	vs->current_cargo = this->current_cargo;
	vs->current_time = this->current_time;
	vs->current_distance = this->current_distance;
	return vs;
}